

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void feintrack::copy_24to24_flip
               (uchar *dest_buf,uchar *src_buf,uint32_t src_width,uint32_t src_heght)

{
  uchar *puVar1;
  uint32_t uVar2;
  uchar *puVar3;
  
  if (src_heght != 0) {
    uVar2 = 0;
    puVar1 = src_buf + src_width * 3 * src_heght;
    do {
      puVar3 = puVar1 + -(ulong)(src_width * 3);
      if (src_width != 0) {
        do {
          *dest_buf = *puVar3;
          dest_buf[1] = puVar3[1];
          dest_buf[2] = puVar3[2];
          puVar3 = puVar3 + 3;
          dest_buf = dest_buf + 3;
        } while (puVar3 != puVar1);
      }
      uVar2 = uVar2 + 1;
      puVar1 = puVar1 + -(ulong)(src_width * 3);
    } while (uVar2 != src_heght);
  }
  return;
}

Assistant:

void copy_24to24_flip(uchar* dest_buf, const uchar* src_buf, uint32_t src_width, uint32_t src_heght)
	{
        uint32_t src_pitch = 3 * src_width;
		src_buf += src_pitch * src_heght;
        const uchar* from_ptr(nullptr);
        for (uint32_t i = 0; i < src_heght; ++i)
		{
			from_ptr = src_buf - src_pitch;
			for (; from_ptr != src_buf; from_ptr += 3, dest_buf += 3)
			{
				dest_buf[0] = from_ptr[0];
				dest_buf[1] = from_ptr[1];
				dest_buf[2] = from_ptr[2];
			}
			src_buf -= src_pitch;
		}
	}